

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilCountPairsOne(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  int i;
  int iVar1;
  int i_00;
  int i_01;
  int iVar2;
  
  iVar1 = vSupport->nSize;
  i_00 = 0;
  iVar2 = 0;
  while (i_00 < iVar1) {
    i = Vec_IntEntry(vSupport,i_00);
    i_00 = i_00 + 1;
    for (i_01 = i_00; iVar1 = vSupport->nSize, i_01 < iVar1; i_01 = i_01 + 1) {
      iVar1 = Vec_IntEntry(vSupport,i_01);
      iVar1 = Extra_BitMatrixLookup1(pMat,i,iVar1);
      iVar2 = iVar2 + iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Sim_UtilCountPairsOne( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    int Counter = 0;
//    int Counter2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        Counter += Extra_BitMatrixLookup1( pMat, i, k );
//    Counter2 = Extra_BitMatrixCountOnesUpper(pMat);
//    assert( Counter == Counter2 );
    return Counter;
}